

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)

{
  int *piVar1;
  ImVector<unsigned_short> *pIVar2;
  ImGuiKeyData *pIVar3;
  float *pfVar4;
  float fVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ImGuiInputEvent *pIVar10;
  unsigned_short *puVar11;
  undefined8 uVar12;
  ImGuiInputEventMousePos IVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  ImGuiContext *pIVar17;
  uint uVar18;
  unsigned_short *__dest;
  ImGuiInputEvent *pIVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  bool bVar25;
  uint uVar26;
  long lVar27;
  char cVar28;
  undefined7 in_register_00000039;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  undefined8 *puVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  ImBitArray<645,_0> key_changed_mask;
  uint local_88 [22];
  
  pIVar17 = GImGui;
  uVar29 = CONCAT71(in_register_00000039,trickle_fast_inputs);
  uVar30 = 0;
  bVar33 = false;
  if ((int)uVar29 != 0) {
    bVar33 = GImGui->WantTextInputNextFrame == 1;
  }
  local_88[0x10] = 0;
  local_88[0x11] = 0;
  local_88[0x12] = 0;
  local_88[0x13] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0x14] = 0;
  if (0 < (GImGui->InputEventsQueue).Size) {
    uVar30 = 0;
    lVar27 = 0x10;
    bVar25 = false;
    bVar16 = false;
    bVar8 = false;
    bVar15 = false;
    uVar22 = 0;
    do {
      pIVar10 = (pIVar17->InputEventsQueue).Data;
      cVar28 = (char)uVar29;
      switch(*(undefined4 *)((long)pIVar10 + lVar27 + -0x10)) {
      case 1:
        fVar35 = *(float *)((long)pIVar10 + lVar27 + -8);
        fVar34 = *(float *)((long)pIVar10 + lVar27 + -4);
        if ((-256000.0 <= fVar35) && (-256000.0 <= fVar34)) {
          if (0.0 <= fVar35) {
LAB_00111d1b:
            iVar23 = (int)fVar35;
          }
          else {
            if ((fVar35 == (float)(int)fVar35) && (!NAN(fVar35) && !NAN((float)(int)fVar35)))
            goto LAB_00111d1b;
            iVar23 = (int)fVar35 + -1;
          }
          if (0.0 <= fVar34) {
LAB_00111d3a:
            iVar31 = (int)fVar34;
          }
          else {
            if ((fVar34 == (float)(int)fVar34) && (!NAN(fVar34) && !NAN((float)(int)fVar34)))
            goto LAB_00111d3a;
            iVar31 = (int)fVar34 + -1;
          }
          fVar35 = (float)iVar23;
          fVar34 = (float)iVar31;
        }
        fVar5 = (pIVar17->IO).MousePos.x;
        if ((fVar5 == fVar35) && (!NAN(fVar5) && !NAN(fVar35))) {
          fVar5 = (pIVar17->IO).MousePos.y;
          if ((fVar5 == fVar34) && (!NAN(fVar5) && !NAN(fVar34))) {
            bVar6 = false;
            bVar14 = true;
            goto LAB_00111fff;
          }
        }
        if ((cVar28 == '\0') ||
           ((((bVar6 = true, uVar22 == 0 && (!bVar16)) && (!bVar8)) && (!bVar15)))) {
          (pIVar17->IO).MousePos.x = fVar35;
          (pIVar17->IO).MousePos.y = fVar34;
          bVar14 = true;
          bVar6 = false;
          bVar25 = true;
        }
        else {
          bVar14 = false;
        }
        goto LAB_00111fff;
      case 2:
        fVar35 = *(float *)((long)pIVar10 + lVar27 + -8);
        if (((fVar35 != 0.0) || (NAN(fVar35))) ||
           ((fVar34 = *(float *)((long)pIVar10 + lVar27 + -4), fVar34 != 0.0 || (NAN(fVar34))))) {
          if ((cVar28 != '\0') && (bVar6 = true, uVar22 != 0 || bVar16)) goto LAB_001121a8;
          (pIVar17->IO).MouseWheelH = fVar35 + (pIVar17->IO).MouseWheelH;
          (pIVar17->IO).MouseWheel =
               *(float *)((long)pIVar10 + lVar27 + -4) + (pIVar17->IO).MouseWheel;
          bVar16 = true;
        }
        break;
      case 3:
        uVar9 = *(uint *)((long)pIVar10 + lVar27 + -8);
        bVar7 = *(bool *)((long)pIVar10 + lVar27 + -4);
        bVar6 = false;
        bVar14 = true;
        if ((pIVar17->IO).MouseDown[(int)uVar9] != bVar7) {
          if ((cVar28 == '\0') || (((uVar22 >> (uVar9 & 0x1f) & 1) == 0 && (!bVar16)))) {
            (pIVar17->IO).MouseDown[(int)uVar9] = bVar7;
            uVar22 = uVar22 | 1 << (uVar9 & 0x1f);
          }
          else {
            bVar14 = false;
            bVar6 = true;
          }
        }
LAB_00111fff:
        if (bVar14) break;
        goto LAB_001121a8;
      case 4:
        uVar9 = *(uint *)((long)pIVar10 + lVar27 + -8);
        pIVar3 = (pIVar17->IO).KeysData + (int)uVar9;
        bVar6 = (pIVar17->IO).KeysData[(int)uVar9].Down;
        bVar7 = *(bool *)((long)pIVar10 + lVar27 + -4);
        if (bVar6 == bVar7) {
          pfVar4 = (float *)((long)&pIVar10->Type + lVar27);
          if ((pIVar3->AnalogValue != *pfVar4) || (NAN(pIVar3->AnalogValue) || NAN(*pfVar4)))
          goto LAB_00111e3a;
          bVar6 = false;
          bVar14 = true;
        }
        else {
LAB_00111e3a:
          if (cVar28 == '\x01' && bVar6 != bVar7) {
            bVar14 = false;
            bVar6 = true;
            if ((((local_88[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0) || (bVar15)) ||
               (uVar22 != 0)) goto LAB_001121a1;
          }
          pIVar3->Down = bVar7;
          pIVar3->AnalogValue = *(float *)((long)&pIVar10->Type + lVar27);
          local_88[(int)uVar9 >> 5] = local_88[(int)uVar9 >> 5] | 1 << ((byte)uVar9 & 0x1f);
          if (uVar9 - 0x281 < 4) {
            switch(uVar9) {
            case 0x281:
              (pIVar17->IO).KeyCtrl = bVar7;
              break;
            case 0x282:
              (pIVar17->IO).KeyShift = bVar7;
              break;
            case 0x283:
              (pIVar17->IO).KeyAlt = bVar7;
              break;
            case 0x284:
              (pIVar17->IO).KeySuper = bVar7;
            }
            bVar8 = (GImGui->IO).KeyCtrl;
            uVar18 = bVar8 + 2;
            if ((GImGui->IO).KeyShift == false) {
              uVar18 = (uint)bVar8;
            }
            uVar26 = uVar18 + 4;
            if ((GImGui->IO).KeyAlt == false) {
              uVar26 = uVar18;
            }
            uVar18 = uVar26 + 8;
            if ((GImGui->IO).KeySuper == false) {
              uVar18 = uVar26;
            }
            (pIVar17->IO).KeyMods = uVar18;
          }
          (pIVar17->IO).KeysDown[(int)uVar9] = bVar7;
          lVar24 = (long)(pIVar17->IO).KeyMap[(int)uVar9];
          bVar6 = false;
          if (lVar24 != -1) {
            (pIVar17->IO).KeysDown[lVar24] = pIVar3->Down;
          }
          bVar14 = true;
          bVar8 = true;
        }
LAB_001121a1:
        if (bVar14) break;
        goto LAB_001121a8;
      case 5:
        if (cVar28 != '\0') {
          if (bVar8) {
            bVar6 = true;
            if (uVar22 == 0 && !bVar33) {
LAB_00111f92:
              bVar6 = true;
              if ((!bVar25) && (!bVar16)) goto LAB_00111fa8;
            }
          }
          else {
            bVar6 = true;
            if (uVar22 == 0) goto LAB_00111f92;
          }
          goto LAB_001121a8;
        }
LAB_00111fa8:
        uVar9 = *(uint *)((long)pIVar10 + lVar27 + -8);
        if (0xffff < uVar9) {
          uVar9 = 0xfffd;
        }
        iVar23 = (pIVar17->IO).InputQueueCharacters.Size;
        iVar31 = (pIVar17->IO).InputQueueCharacters.Capacity;
        if (iVar23 == iVar31) {
          if (iVar31 == 0) {
            iVar20 = 8;
          }
          else {
            iVar20 = iVar31 / 2 + iVar31;
          }
          iVar23 = iVar23 + 1;
          if (iVar23 < iVar20) {
            iVar23 = iVar20;
          }
          if (iVar31 < iVar23) {
            if (GImGui != (ImGuiContext *)0x0) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + 1;
            }
            __dest = (unsigned_short *)
                     (*GImAllocatorAllocFunc)((long)iVar23 * 2,GImAllocatorUserData);
            puVar11 = (pIVar17->IO).InputQueueCharacters.Data;
            if (puVar11 != (unsigned_short *)0x0) {
              memcpy(__dest,puVar11,(long)(pIVar17->IO).InputQueueCharacters.Size * 2);
              puVar11 = (pIVar17->IO).InputQueueCharacters.Data;
              if ((puVar11 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar1 = *piVar1 + -1;
              }
              (*GImAllocatorFreeFunc)(puVar11,GImAllocatorUserData);
            }
            (pIVar17->IO).InputQueueCharacters.Data = __dest;
            (pIVar17->IO).InputQueueCharacters.Capacity = iVar23;
            uVar29 = uVar29 & 0xffffffff;
          }
        }
        (pIVar17->IO).InputQueueCharacters.Data[(pIVar17->IO).InputQueueCharacters.Size] =
             (unsigned_short)uVar9;
        pIVar2 = &(pIVar17->IO).InputQueueCharacters;
        pIVar2->Size = pIVar2->Size + 1;
        if (bVar33) {
          bVar15 = true;
        }
        break;
      case 6:
        (pIVar17->IO).AppFocusLost = (bool)(*(byte *)((long)pIVar10 + lVar27 + -8) ^ 1);
      }
      bVar6 = false;
LAB_001121a8:
      if (bVar6) break;
      uVar30 = uVar30 + 1;
      lVar27 = lVar27 + 0x18;
    } while ((long)uVar30 < (long)(pIVar17->InputEventsQueue).Size);
  }
  iVar23 = (int)uVar30;
  uVar30 = uVar30 & 0xffffffff;
  if (iVar23 != 0) {
    lVar27 = 0;
    do {
      puVar32 = (undefined8 *)((long)&((pIVar17->InputEventsQueue).Data)->Type + lVar27);
      iVar31 = (pIVar17->InputEventsTrail).Size;
      iVar20 = (pIVar17->InputEventsTrail).Capacity;
      if (iVar31 == iVar20) {
        if (iVar20 == 0) {
          iVar21 = 8;
        }
        else {
          iVar21 = iVar20 / 2 + iVar20;
        }
        iVar31 = iVar31 + 1;
        if (iVar31 < iVar21) {
          iVar31 = iVar21;
        }
        if (iVar20 < iVar31) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pIVar19 = (ImGuiInputEvent *)
                    (*GImAllocatorAllocFunc)((long)iVar31 * 0x18,GImAllocatorUserData);
          pIVar10 = (pIVar17->InputEventsTrail).Data;
          if (pIVar10 != (ImGuiInputEvent *)0x0) {
            memcpy(pIVar19,pIVar10,(long)(pIVar17->InputEventsTrail).Size * 0x18);
            pIVar10 = (pIVar17->InputEventsTrail).Data;
            if ((pIVar10 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
          }
          (pIVar17->InputEventsTrail).Data = pIVar19;
          (pIVar17->InputEventsTrail).Capacity = iVar31;
        }
      }
      pIVar10 = (pIVar17->InputEventsTrail).Data;
      iVar31 = (pIVar17->InputEventsTrail).Size;
      *(undefined8 *)((long)&pIVar10[iVar31].field_2 + 8) = puVar32[2];
      uVar12 = *puVar32;
      IVar13 = *(ImGuiInputEventMousePos *)(puVar32 + 1);
      pIVar10 = pIVar10 + iVar31;
      pIVar10->Type = (int)uVar12;
      pIVar10->Source = (int)((ulong)uVar12 >> 0x20);
      (pIVar10->field_2).MousePos = IVar13;
      (pIVar17->InputEventsTrail).Size = (pIVar17->InputEventsTrail).Size + 1;
      lVar27 = lVar27 + 0x18;
    } while (uVar30 * 0x18 != lVar27);
  }
  iVar31 = (pIVar17->InputEventsQueue).Size;
  if (iVar23 == iVar31) {
    iVar31 = (pIVar17->InputEventsQueue).Capacity;
    iVar23 = 0;
    if (iVar31 < 0) {
      uVar22 = iVar31 / 2 + iVar31;
      uVar30 = 0;
      if (0 < (int)uVar22) {
        uVar30 = (ulong)uVar22;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar19 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(uVar30 * 0x18,GImAllocatorUserData);
      pIVar10 = (pIVar17->InputEventsQueue).Data;
      if (pIVar10 != (ImGuiInputEvent *)0x0) {
        memcpy(pIVar19,pIVar10,(long)(pIVar17->InputEventsQueue).Size * 0x18);
        pIVar10 = (pIVar17->InputEventsQueue).Data;
        if ((pIVar10 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
      }
      (pIVar17->InputEventsQueue).Data = pIVar19;
      (pIVar17->InputEventsQueue).Capacity = (int)uVar30;
      iVar23 = 0;
    }
  }
  else {
    pIVar10 = (pIVar17->InputEventsQueue).Data;
    memmove(pIVar10,pIVar10 + uVar30,((long)iVar31 - uVar30) * 0x18);
    iVar23 = (pIVar17->InputEventsQueue).Size - iVar23;
  }
  (pIVar17->InputEventsQueue).Size = iVar23;
  if ((pIVar17->IO).AppFocusLost == true) {
    memset((pIVar17->IO).KeysDown,0,0x285);
    lVar27 = 0xe08;
    do {
      *(undefined1 *)((long)pIVar17 + lVar27 + -4) = 0;
      *(undefined8 *)(&pIVar17->Initialized + lVar27) = 0xbf800000bf800000;
      lVar27 = lVar27 + 0x10;
    } while (lVar27 != 0x3658);
    (pIVar17->IO).KeyMods = 0;
    (pIVar17->IO).KeyCtrl = false;
    (pIVar17->IO).KeyShift = false;
    (pIVar17->IO).KeyAlt = false;
    (pIVar17->IO).KeySuper = false;
    lVar27 = -0x14;
    do {
      pfVar4 = (pIVar17->IO).NavInputsDownDurationPrev + lVar27 + 0x14;
      pfVar4[0] = -1.0;
      pfVar4[1] = -1.0;
      pfVar4[2] = -1.0;
      pfVar4[3] = -1.0;
      pfVar4 = (pIVar17->IO).NavInputsDownDurationPrev + lVar27;
      pfVar4[0] = -1.0;
      pfVar4[1] = -1.0;
      pfVar4[2] = -1.0;
      pfVar4[3] = -1.0;
      lVar27 = lVar27 + 4;
    } while (lVar27 != 0);
    (pIVar17->IO).AppFocusLost = false;
  }
  return;
}

Assistant:

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Only trickle chars<>key when working with InputText()
    // FIXME: InputText() could parse event trail?
    // FIXME: Could specialize chars<>keys trickling rules for control keys (those not typically associated to characters)
    const bool trickle_interleaved_keys_and_text = (trickle_fast_inputs && g.WantTextInputNextFrame == 1);

    bool mouse_moved = false, mouse_wheeled = false, key_changed = false, text_inputted = false;
    int  mouse_button_changed = 0x00;
    ImBitArray<ImGuiKey_KeysData_SIZE> key_changed_mask;

    int event_n = 0;
    for (; event_n < g.InputEventsQueue.Size; event_n++)
    {
        const ImGuiInputEvent* e = &g.InputEventsQueue[event_n];
        if (e->Type == ImGuiInputEventType_MousePos)
        {
            ImVec2 event_pos(e->MousePos.PosX, e->MousePos.PosY);
            if (IsMousePosValid(&event_pos))
                event_pos = ImVec2(ImFloorSigned(event_pos.x), ImFloorSigned(event_pos.y)); // Apply same flooring as UpdateMouseInputs()
            if (io.MousePos.x != event_pos.x || io.MousePos.y != event_pos.y)
            {
                // Trickling Rule: Stop processing queued events if we already handled a mouse button change
                if (trickle_fast_inputs && (mouse_button_changed != 0 || mouse_wheeled || key_changed || text_inputted))
                    break;
                io.MousePos = event_pos;
                mouse_moved = true;
            }
        }
        else if (e->Type == ImGuiInputEventType_MouseButton)
        {
            const ImGuiMouseButton button = e->MouseButton.Button;
            IM_ASSERT(button >= 0 && button < ImGuiMouseButton_COUNT);
            if (io.MouseDown[button] != e->MouseButton.Down)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the same button
                if (trickle_fast_inputs && ((mouse_button_changed & (1 << button)) || mouse_wheeled))
                    break;
                io.MouseDown[button] = e->MouseButton.Down;
                mouse_button_changed |= (1 << button);
            }
        }
        else if (e->Type == ImGuiInputEventType_MouseWheel)
        {
            if (e->MouseWheel.WheelX != 0.0f || e->MouseWheel.WheelY != 0.0f)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the event
                if (trickle_fast_inputs && (mouse_wheeled || mouse_button_changed != 0))
                    break;
                io.MouseWheelH += e->MouseWheel.WheelX;
                io.MouseWheel += e->MouseWheel.WheelY;
                mouse_wheeled = true;
            }
        }
        else if (e->Type == ImGuiInputEventType_Key)
        {
            ImGuiKey key = e->Key.Key;
            IM_ASSERT(key != ImGuiKey_None);
            const int keydata_index = (key - ImGuiKey_KeysData_OFFSET);
            ImGuiKeyData* keydata = &io.KeysData[keydata_index];
            if (keydata->Down != e->Key.Down || keydata->AnalogValue != e->Key.AnalogValue)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the same button
                if (trickle_fast_inputs && keydata->Down != e->Key.Down && (key_changed_mask.TestBit(keydata_index) || text_inputted || mouse_button_changed != 0))
                    break;
                keydata->Down = e->Key.Down;
                keydata->AnalogValue = e->Key.AnalogValue;
                key_changed = true;
                key_changed_mask.SetBit(keydata_index);

                if (key == ImGuiKey_ModCtrl || key == ImGuiKey_ModShift || key == ImGuiKey_ModAlt || key == ImGuiKey_ModSuper)
                {
                    if (key == ImGuiKey_ModCtrl) { io.KeyCtrl = keydata->Down; }
                    if (key == ImGuiKey_ModShift) { io.KeyShift = keydata->Down; }
                    if (key == ImGuiKey_ModAlt) { io.KeyAlt = keydata->Down; }
                    if (key == ImGuiKey_ModSuper) { io.KeySuper = keydata->Down; }
                    io.KeyMods = GetMergedKeyModFlags();
                }

                // Allow legacy code using io.KeysDown[GetKeyIndex()] with new backends
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
                io.KeysDown[key] = keydata->Down;
                if (io.KeyMap[key] != -1)
                    io.KeysDown[io.KeyMap[key]] = keydata->Down;
#endif
            }
        }
        else if (e->Type == ImGuiInputEventType_Text)
        {
            // Trickling Rule: Stop processing queued events if keys/mouse have been interacted with
            if (trickle_fast_inputs && ((key_changed && trickle_interleaved_keys_and_text) || mouse_button_changed != 0 || mouse_moved || mouse_wheeled))
                break;
            unsigned int c = e->Text.Char;
            io.InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
            if (trickle_interleaved_keys_and_text)
                text_inputted = true;
        }
        else if (e->Type == ImGuiInputEventType_Focus)
        {
            // We intentionally overwrite this and process lower, in order to give a chance
            // to multi-viewports backends to queue AddFocusEvent(false) + AddFocusEvent(true) in same frame.
            io.AppFocusLost = !e->AppFocused.Focused;
        }
        else
        {
            IM_ASSERT(0 && "Unknown event!");
        }
    }

    // Record trail (for domain-specific applications wanting to access a precise trail)
    //if (event_n != 0) IMGUI_DEBUG_LOG("Processed: %d / Remaining: %d\n", event_n, g.InputEventsQueue.Size - event_n);
    for (int n = 0; n < event_n; n++)
        g.InputEventsTrail.push_back(g.InputEventsQueue[n]);

    // [DEBUG]
    /*if (event_n != 0)
        for (int n = 0; n < g.InputEventsQueue.Size; n++)
            DebugLogInputEvent(n < event_n ? "Processed" : "Remaining", &g.InputEventsQueue[n]);*/

    // Remaining events will be processed on the next frame
    if (event_n == g.InputEventsQueue.Size)
        g.InputEventsQueue.resize(0);
    else
        g.InputEventsQueue.erase(g.InputEventsQueue.Data, g.InputEventsQueue.Data + event_n);

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }
}